

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sec.c
# Opt level: O0

void CRYPTO_secure_free(void *ptr)

{
  int iVar1;
  uchar *puVar2;
  long in_RDI;
  size_t unprotected_size;
  size_t total_size;
  uchar *unprotected_ptr;
  uchar *canary_ptr;
  uchar *base_ptr;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffe0;
  
  if (in_RDI != 0) {
    puVar2 = _unprotected_ptr_from_user_ptr(in_stack_ffffffffffffffe0);
    puVar2 = *(uchar **)(puVar2 + page_size * -2);
    _mprotect_readwrite(puVar2,in_stack_ffffffffffffffc8);
    iVar1 = CRYPTO_memcmp((void *)(in_RDI + -0x10),canary,0x10);
    if (iVar1 != 0) {
      _out_of_bounds();
    }
    CRYPTO_munlock(puVar2,in_stack_ffffffffffffffc8);
    _free_aligned(puVar2,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CRYPTO_secure_free(void *ptr)
{
    unsigned char *base_ptr;
    unsigned char *canary_ptr;
    unsigned char *unprotected_ptr;
    size_t         total_size;
    size_t         unprotected_size;

    if (ptr == NULL) {
        return;
    }
    canary_ptr      = ((unsigned char *) ptr) - sizeof canary;
    unprotected_ptr = _unprotected_ptr_from_user_ptr(ptr);
    base_ptr        = unprotected_ptr - page_size * 2U;
    memcpy(&unprotected_size, base_ptr, sizeof unprotected_size);
    total_size = page_size + page_size + unprotected_size + page_size;
    _mprotect_readwrite(base_ptr, total_size);
    if (CRYPTO_memcmp(canary_ptr, canary, sizeof canary) != 0) {
        _out_of_bounds();
    }
# ifndef HAVE_PAGE_PROTECTION
    if (CRYPTO_memcmp(unprotected_ptr + unprotected_size, canary,
                      sizeof canary) != 0) {
        _out_of_bounds();
    }
# endif
    CRYPTO_munlock(unprotected_ptr, unprotected_size);
    _free_aligned(base_ptr, total_size);
}